

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O1

char * __thiscall
Memory::LargeHeapBlock::AllocFreeListEntry
          (LargeHeapBlock *this,size_t size,ObjectInfoBits attributes,
          LargeHeapBlockFreeListEntry *entry)

{
  LargeHeapBlockFreeListEntry *address;
  byte bVar1;
  uint uVar2;
  size_t size_00;
  ConfigFlagsTable *pCVar3;
  HeapInfo *pHVar4;
  code *pcVar5;
  bool bVar6;
  HeapInfo *heapInfo;
  undefined4 *puVar7;
  LargeHeapBlockFreeListEntry *pLVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  undefined6 in_register_00000012;
  ulong uVar12;
  uint uVar13;
  
  uVar12 = CONCAT62(in_register_00000012,attributes);
  if (0x3ff < (uint)uVar12) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x204,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar6) goto LAB_006f12d3;
    *puVar7 = 0;
  }
  if (size == 0 || (size & 0xf) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x205,"(HeapInfo::IsAlignedSize(size))","HeapInfo::IsAlignedSize(size)");
    if (!bVar6) goto LAB_006f12d3;
    *puVar7 = 0;
  }
  if ((attributes & TrackBit) != NoBit) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x209,"((attributes & TrackBit) == 0)",
                       "Large tracked object collection not implemented");
    if (!bVar6) goto LAB_006f12d3;
    *puVar7 = 0;
  }
  if (entry->heapBlock != this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x20b,"(entry->heapBlock == this)","entry->heapBlock == this");
    if (!bVar6) goto LAB_006f12d3;
    *puVar7 = 0;
  }
  if (this->objectCount <= entry->headerIndex) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x20c,"(entry->headerIndex < this->objectCount)",
                       "entry->headerIndex < this->objectCount");
    if (!bVar6) goto LAB_006f12d3;
    *puVar7 = 0;
  }
  if ((&this[1].super_HeapBlock._vptr_HeapBlock)[entry->headerIndex] != (_func_int **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x20d,"(this->HeaderList()[entry->headerIndex] == nullptr)",
                       "this->HeaderList()[entry->headerIndex] == nullptr");
    if (!bVar6) goto LAB_006f12d3;
    *puVar7 = 0;
  }
  size_00 = entry->objectSize;
  address = entry + 1;
  pLVar8 = (LargeHeapBlockFreeListEntry *)((long)&entry[1].headerIndex + size);
  if ((pLVar8 < address || (LargeHeapBlockFreeListEntry *)this->addressEnd < pLVar8) ||
      (LargeHeapBlockFreeListEntry *)((long)&entry[1].headerIndex + size_00) < pLVar8) {
    return (char *)0x0;
  }
  uVar2 = entry->headerIndex;
  if (this->heapInfo->recycler->verifyEnabled != false) {
    Recycler::VerifyCheckFill(address,size_00);
  }
  memset(entry,0,size_00 + 0x20);
  if (this->heapInfo->recycler->verifyEnabled != false) {
    memset(address,0xca,size_00);
  }
  pCVar3 = this->heapInfo->recycler->recyclerFlagsTable;
  if ((pCVar3->Verbose == true) &&
     ((bVar6 = Js::Phases::IsEnabled(&pCVar3->Trace,MemoryAllocationPhase), bVar6 ||
      (bVar6 = Js::Phases::IsEnabled
                         (&this->heapInfo->recycler->recyclerFlagsTable->Trace,
                          LargeMemoryAllocationPhase), bVar6)))) {
    Output::Print(L"Allocated object of size 0x%x in from free list entry at address 0x%p\n",size,
                  address);
  }
  if (this->objectCount < this->allocCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x232,"(allocCount <= objectCount)","allocCount <= objectCount");
    if (!bVar6) {
LAB_006f12d3:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar7 = 0;
    uVar12 = uVar12 & 0xffffffff;
  }
  entry->headerIndex = uVar2;
  entry->objectSize = size_00;
  bVar1 = *(byte *)((long)&entry->next + 2);
  uVar13 = (uint)uVar12;
  bVar9 = (byte)((uVar12 & 0xffffffff) >> 7) & 2;
  *(byte *)((long)&entry->next + 2) = bVar1 & 0xfd | bVar9;
  if ((uVar12 & 0x90) != 0) {
    *(undefined ***)address = &PTR_Finalize_014da980;
  }
  uVar11 = this->heapInfo->recycler->Cookie;
  uVar10 = *(uint *)&entry->heapBlock ^ uVar11;
  uVar11 = ((uVar10 >> 0x18 ^ uVar10 ^ uVar10 >> 0x10 ^ uVar10 >> 8 ^ uVar13) & 0xff | uVar13 << 8)
           ^ uVar11;
  *(short *)&entry->next = (short)uVar11;
  *(byte *)((long)&entry->next + 2) = bVar1 & 0xfc | bVar9;
  pHVar4 = this->heapInfo;
  uVar10 = pHVar4->recycler->Cookie;
  uVar11 = uVar11 ^ uVar10;
  *(ushort *)&entry->next =
       ((ushort)uVar11 & 0xff00 | (ushort)(uVar11 >> 8) & 0xff) ^ (ushort)uVar10;
  entry->heapBlock = (LargeHeapBlock *)(ulong)uVar10;
  (&this[1].super_HeapBlock._vptr_HeapBlock)[uVar2] = (_func_int **)entry;
  this->finalizeCount = this->finalizeCount + ((uVar13 & 0x80) >> 7);
  if ((uVar12 & 0x80) != 0) {
    pHVar4->liveFinalizableObjectCount = pHVar4->liveFinalizableObjectCount + 1;
    pHVar4->newFinalizableObjectCount = pHVar4->newFinalizableObjectCount + 1;
  }
  return (char *)address;
}

Assistant:

char*
LargeHeapBlock::AllocFreeListEntry(DECLSPEC_GUARD_OVERFLOW size_t size, ObjectInfoBits attributes, LargeHeapBlockFreeListEntry* entry)
{
    Assert((attributes & InternalObjectInfoBitMask) == attributes);
    Assert(HeapInfo::IsAlignedSize(size));
#ifdef RECYCLER_VISITED_HOST
    AssertMsg((attributes & TrackBit) == 0 || (attributes & RecyclerVisitedHostBit), "Large tracked object implemented just for recycler visited objects");
#else
    AssertMsg((attributes & TrackBit) == 0, "Large tracked object collection not implemented");
#endif
    Assert(entry->heapBlock == this);
    Assert(entry->headerIndex < this->objectCount);
    Assert(this->HeaderList()[entry->headerIndex] == nullptr);

    uint headerIndex = entry->headerIndex;
    size_t originalSize = entry->objectSize;

    LargeObjectHeader * header = (LargeObjectHeader *) entry;

    char * allocObject = ((char*) entry) + sizeof(LargeObjectHeader);       // shouldn't overflow
    char * newAllocAddressEnd = allocObject + size;
    char * originalAllocEnd = allocObject + originalSize;
    if (newAllocAddressEnd > addressEnd || newAllocAddressEnd < allocObject || (originalAllocEnd < newAllocAddressEnd))
    {
        return nullptr;
    }

#ifdef RECYCLER_MEMORY_VERIFY
    if (this->heapInfo->recycler->VerifyEnabled())
    {
        this->heapInfo->recycler->VerifyCheckFill(allocObject , originalSize);
    }
#endif

    memset(entry, 0, sizeof(LargeObjectHeader) + originalSize);

#ifdef RECYCLER_MEMORY_VERIFY
    // If we're in recyclerVerify mode, fill the non-header part of the allocation
    // with the verification pattern
    if (this->heapInfo->recycler->VerifyEnabled())
    {
        memset(allocObject, Recycler::VerifyMemFill, originalSize);
    }
#endif

#if DBG
    LargeAllocationVerboseTrace(this->heapInfo->recycler->GetRecyclerFlagsTable(), _u("Allocated object of size 0x%x in from free list entry at address 0x%p\n"), size, allocObject);
#endif

    Assert(allocCount <= objectCount);

    header->objectIndex = headerIndex;
    header->objectSize = originalSize;
#ifdef RECYCLER_WRITE_BARRIER
    header->hasWriteBarrier = (attributes & WithBarrierBit) == WithBarrierBit;
#endif

    if ((attributes & (FinalizeBit | TrackBit)) != 0)
    {
        // Make sure a valid vtable is installed as once the attributes have been set this allocation may be traced by background marking
        allocObject = (char *)new (allocObject) DummyVTableObject();
#if defined(_M_ARM32_OR_ARM64)
        // On ARM, make sure the v-table write is performed before setting the attributes
        MemoryBarrier();
#endif
    }
    header->SetAttributes(this->heapInfo->recycler->Cookie, (attributes & StoredObjectInfoBitMask));
    header->markOnOOMRescan = false;
    header->SetNext(this->heapInfo->recycler->Cookie, nullptr);

    HeaderList()[headerIndex] = header;
    finalizeCount += ((attributes & FinalizeBit) != 0);

#ifdef RECYCLER_FINALIZE_CHECK
    if (attributes & FinalizeBit)
    {
        HeapInfo * heapInfo = this->heapInfo;
        heapInfo->liveFinalizableObjectCount++;
        heapInfo->newFinalizableObjectCount++;
    }
#endif

    return allocObject;
}